

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

int Ssw_ClassesRefineConst1(Ssw_Cla_t *p,int fRecursive)

{
  Aig_Man_t *p_00;
  Aig_Obj_t **pClass;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj;
  ulong uVar4;
  Aig_Obj_t *pRepr;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  int i;
  
  p->vClassNew->nSize = 0;
  for (lVar6 = 0; p_00 = p->pAig, lVar6 < p_00->vObjs->nSize; lVar6 = lVar6 + 1) {
    if (p_00->pReprs[lVar6] == p_00->pConst1) {
      pAVar3 = Aig_ManObj(p_00,(int)lVar6);
      iVar1 = (*p->pFuncNodeIsConst)(p->pManData,pAVar3);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar3);
      }
    }
  }
  pVVar5 = p->vClassNew;
  iVar1 = pVVar5->nSize;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else if (p->fConstCorr == 0) {
    p->nCands1 = p->nCands1 - iVar1;
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,0);
    Aig_ObjSetRepr(p->pAig,pAVar3,(Aig_Obj_t *)0x0);
    pVVar5 = p->vClassNew;
    uVar4 = (ulong)pVVar5->nSize;
    iVar2 = 1;
    if (uVar4 != 1) {
      pClass = p->pMemClassesFree;
      p->pMemClassesFree = pClass + uVar4;
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,(int)lVar6);
        pClass[lVar6] = pObj;
        pRepr = pAVar3;
        if (lVar6 == 0) {
          pRepr = (Aig_Obj_t *)0x0;
        }
        Aig_ObjSetRepr(p->pAig,pObj,pRepr);
        pVVar5 = p->vClassNew;
        uVar4 = (ulong)(uint)pVVar5->nSize;
      }
      Ssw_ObjAddClass(p,pAVar3,pClass,(int)uVar4);
      if (fRecursive != 0) {
        iVar2 = Ssw_ClassesRefineOneClass(p,pAVar3,1);
        iVar2 = iVar2 + 1;
      }
    }
  }
  else {
    iVar2 = 1;
    for (i = 0; i < iVar1; i = i + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,i);
      Aig_ObjSetRepr(p->pAig,pAVar3,(Aig_Obj_t *)0x0);
      pVVar5 = p->vClassNew;
      iVar1 = pVVar5->nSize;
    }
  }
  return iVar2;
}

Assistant:

int Ssw_ClassesRefineConst1( Ssw_Cla_t * p, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    for ( i = 0; i < Vec_PtrSize(p->pAig->vObjs); i++ )
        if ( p->pAig->pReprs[i] == Aig_ManConst1(p->pAig) )
        {
            pObj = Aig_ManObj( p->pAig, i );
            if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            {
                Vec_PtrPush( p->vClassNew, pObj );
//                Vec_PtrPush( p->vRefined, pObj );
            }
        }
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    if ( p->fConstCorr )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
            Aig_ObjSetRepr( p->pAig, pObj, NULL );
        return 1;
    }
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Ssw_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}